

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t zeEventHostReset(ze_event_handle_t hEvent)

{
  ze_pfnEventHostReset_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnEventHostReset_t pfnHostReset;
  ze_event_handle_t hEvent_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->Event).pfnHostReset;
    if (p_Var1 == (ze_pfnEventHostReset_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hEvent_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hEvent_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hEvent_local._4_4_ = (*p_Var1)(hEvent);
    }
  }
  else {
    hEvent_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hEvent_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeEventHostReset(
    ze_event_handle_t hEvent                        ///< [in] handle of the event
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnEventHostReset_t pfnHostReset = [&result] {
        auto pfnHostReset = ze_lib::context->zeDdiTable.load()->Event.pfnHostReset;
        if( nullptr == pfnHostReset ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnHostReset;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnHostReset( hEvent );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnHostReset = ze_lib::context->zeDdiTable.load()->Event.pfnHostReset;
    if( nullptr == pfnHostReset ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnHostReset( hEvent );
    #endif
}